

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmShiftIm<(moira::Instr)70,(moira::Mode)11,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  long in_RDI;
  Dn dst;
  Imd src;
  StrWriter *in_stack_ffffffffffffffb8;
  Dn local_24;
  Imd local_20;
  ushort local_1a;
  StrWriter *local_10;
  
  local_1a = in_CX;
  local_10 = in_RSI;
  Imd::Imd(&local_20,(int)(uint)in_CX >> 9 & 7);
  Dn::Dn(&local_24,local_1a & 7);
  if (local_20.raw == 0) {
    local_20.raw = 8;
  }
  pSVar1 = StrWriter::operator<<(local_10);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI + 0x14));
  pSVar1 = StrWriter::operator<<(in_stack_ffffffffffffffb8,(Imd)(u32)((ulong)in_RDI >> 0x20));
  pSVar1 = StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,local_24);
  return;
}

Assistant:

void
Moira::dasmShiftIm(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imd ( ____xxx_________(op) );
    auto dst = Dn  ( _____________xxx(op) );

    if (src.raw == 0) src.raw = 8;
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}